

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Data.cpp
# Opt level: O0

void __thiscall DL::Data::Data(Data *this,string_t *key,Integer i)

{
  allocator local_41;
  string local_40 [32];
  Integer local_20;
  Integer i_local;
  string_t *key_local;
  Data *this_local;
  
  local_20 = i;
  i_local = (Integer)key;
  key_local = &this->mKey;
  std::__cxx11::string::string((string *)this,(string *)key);
  this->mType = DT_Integer;
  (this->field_2).mInt = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"",&local_41);
  DataGroup::DataGroup(&this->mGroup,(string_t *)local_40);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::__cxx11::string::string((string *)&this->mString);
  return;
}

Assistant:

Data::Data(const string_t& key, Integer i)
	: mKey(key)
	, mType(DT_Integer)
	, mInt(i)
{
}